

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_utils_leb128.c
# Opt level: O3

size_t lj_utils_read_leb128(int64_t *out,uint8_t *buffer)

{
  byte bVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  int64_t value;
  ulong uVar4;
  
  i = 0;
  uVar2 = 0;
  uVar4 = 0;
  do {
    bVar1 = buffer[i];
    i = i + 1;
    uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << ((byte)uVar2 & 0x3f);
    uVar2 = uVar2 + 7;
  } while ((char)bVar1 < '\0');
  uVar3 = (long)(-1 << ((byte)uVar2 & 0x1f));
  if (0x3f < uVar2) {
    uVar3 = 0;
  }
  if (bVar1 < 0x40) {
    uVar3 = 0;
  }
  *out = uVar4 | uVar3;
  return i;
}

Assistant:

size_t LJ_FASTCALL lj_utils_read_leb128(int64_t *out, const uint8_t *buffer)
{
  return _read_leb128(out, buffer, 0);
}